

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_format_binary.c
# Opt level: O0

int log_policy_format_binary_create(log_policy policy,log_policy_ctor ctor)

{
  void *instance;
  log_policy in_RDI;
  log_policy_format_binary_data binary_data;
  undefined4 local_4;
  
  instance = malloc(8);
  if (instance != (void *)0x0) {
    log_policy_instantiate(in_RDI,instance,0);
  }
  local_4 = (uint)(instance == (void *)0x0);
  return local_4;
}

Assistant:

static int log_policy_format_binary_create(log_policy policy, const log_policy_ctor ctor)
{
	log_policy_format_binary_data binary_data = malloc(sizeof(struct log_policy_format_binary_data_type));

	(void)ctor;

	if (binary_data == NULL)
	{
		return 1;
	}

	log_policy_instantiate(policy, binary_data, LOG_POLICY_FORMAT_BINARY);

	return 0;
}